

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSurfaceStyle::~IfcSurfaceStyle(IfcSurfaceStyle *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  (this->super_IfcPresentationStyle).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x85dcb8;
  *(undefined8 *)&this->field_0x80 = 0x85dd08;
  *(undefined8 *)&(this->super_IfcPresentationStyle).field_0x38 = 0x85dce0;
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector(&(this->Styles).
             super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           );
  puVar1 = *(undefined1 **)&(this->super_IfcPresentationStyle).field_0x48;
  if (puVar1 != &this->field_0x58) {
    operator_delete(puVar1,*(long *)&this->field_0x58 + 1);
  }
  (this->super_IfcPresentationStyle).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x85dd30;
  *(undefined8 *)&this->field_0x80 = 0x85dd58;
  puVar2 = *(undefined1 **)
            &(this->super_IfcPresentationStyle).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>.field_0x10;
  puVar1 = &(this->super_IfcPresentationStyle).
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  operator_delete(this,0x98);
  return;
}

Assistant:

IfcSurfaceStyle() : Object("IfcSurfaceStyle") {}